

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_ffb3f::readWholeFiles(int modification)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  float *pfVar9;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar10;
  ChannelList *this_00;
  ChannelList *pCVar11;
  Array2D<float_*> *fData_00;
  size_type sVar12;
  reference pvVar13;
  reference __b;
  uint *puVar14;
  int in_EDI;
  int numYTiles_1;
  int numXTiles_1;
  DeepFrameBuffer frameBuffer_3;
  int h_1;
  int w_1;
  int yLevel_1;
  int xLevel_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputPart part_3;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputPart part_2;
  int numYTiles;
  int numXTiles;
  FrameBuffer frameBuffer_1;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledInputPart part_1;
  InputPart part;
  FrameBuffer frameBuffer;
  size_t i_3;
  int partNumber;
  size_t b;
  size_t a;
  size_t i_2;
  int i_1;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Header *header;
  int i;
  MultiPartInputFile file;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 uVar15;
  int in_stack_fffffffffffffafc;
  Array2D<Imath_3_2::half_*> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  DeepFrameBuffer *in_stack_fffffffffffffb10;
  undefined5 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1d;
  undefined1 in_stack_fffffffffffffb1e;
  undefined1 in_stack_fffffffffffffb1f;
  int in_stack_fffffffffffffb24;
  int in_stack_fffffffffffffb30;
  ulong uVar16;
  undefined4 in_stack_fffffffffffffbd0;
  uint uVar17;
  Array2D<unsigned_int_*> *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  DeepFrameBuffer *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffc00;
  Slice local_320 [56];
  Slice local_2e8 [104];
  undefined4 local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  undefined1 local_268 [64];
  Slice local_228 [104];
  undefined1 local_1c0 [88];
  undefined1 local_168 [8];
  FrameBuffer local_160;
  ulong local_128;
  int local_11c;
  size_type local_118;
  size_type local_110;
  ulong local_108;
  uint local_fc;
  vector<int,_std::allocator<int>_> local_f8;
  undefined8 local_e0;
  int local_d4;
  MultiPartInputFile local_d0 [16];
  Array2D<unsigned_int> local_c0;
  Array2D<Imath_3_2::half_*> local_a8;
  Array2D<float_*> local_90;
  Array2D<unsigned_int_*> local_78;
  Array2D<Imath_3_2::half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  int local_4;
  
  local_4 = in_EDI;
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_3_2::Array2D<float>::Array2D(&local_38);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&local_60);
  Imf_3_2::Array2D<unsigned_int_*>::Array2D(&local_78);
  Imf_3_2::Array2D<float_*>::Array2D(&local_90);
  Imf_3_2::Array2D<Imath_3_2::half_*>::Array2D(&local_a8);
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_c0);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_d0,pcVar8,iVar6,true);
  local_d4 = 0;
  while( true ) {
    iVar6 = local_d4;
    iVar7 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar7 <= iVar6) {
      fData_00 = (Array2D<float_*> *)std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::operator<<(fData_00,std::flush<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bb3b5);
      local_fc = (uint)(0 < local_4);
      while (uVar17 = local_fc,
            sVar12 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::size
                               ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                                (anonymous_namespace)::headers), (int)uVar17 < (int)sVar12) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        local_fc = local_fc + 1;
      }
      local_108 = 0;
      while (uVar16 = local_108, sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_f8),
            uVar16 < sVar12) {
        std::vector<int,_std::allocator<int>_>::size(&local_f8);
        iVar6 = random_int(in_stack_fffffffffffffaf4);
        local_110 = (size_type)iVar6;
        std::vector<int,_std::allocator<int>_>::size(&local_f8);
        iVar6 = random_int(in_stack_fffffffffffffaf4);
        local_118 = (size_type)iVar6;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_110);
        __b = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_118);
        std::swap<int>(pvVar13,__b);
        local_108 = local_108 + 1;
      }
      local_128 = 0;
      do {
        uVar2 = local_128;
        sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_f8);
        if (sVar12 <= uVar2) {
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
          Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_d0);
          Imf_3_2::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          Imf_3_2::Array2D<Imath_3_2::half_*>::~Array2D
                    ((Array2D<Imath_3_2::half_*> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          Imf_3_2::Array2D<float_*>::~Array2D
                    ((Array2D<float_*> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          Imf_3_2::Array2D<unsigned_int_*>::~Array2D
                    ((Array2D<unsigned_int_*> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          Imf_3_2::Array2D<float>::~Array2D
                    ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)
                    );
          Imf_3_2::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          return;
        }
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,local_128);
        local_11c = *pvVar13;
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                             (long)local_11c);
        switch(*pvVar13) {
        case 0:
          Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1bb5e1);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          iVar7 = 0x10;
          setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffbf0,
                              (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                              (Array2D<unsigned_int> *)in_stack_fffffffffffffbe0,
                              (Array2D<float> *)fData_00,
                              (Array2D<Imath_3_2::half> *)CONCAT44(uVar17,in_stack_fffffffffffffbd0)
                              ,(int)(uVar16 >> 0x20),(int)in_stack_fffffffffffffc00);
          Imf_3_2::InputPart::InputPart((InputPart *)&local_160,local_d0,local_11c);
          Imf_3_2::InputPart::setFrameBuffer(&local_160);
          Imf_3_2::InputPart::readPixels((int)&local_160,0);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_11c);
          iVar6 = *pvVar13;
          if (iVar6 == 0) {
            bVar3 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                               in_stack_fffffffffffffaec,iVar7);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x36d,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar6 == 1) {
            bVar3 = checkPixels<float>((Array2D<float> *)
                                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)
                                       ,in_stack_fffffffffffffaec,iVar7);
            if (!bVar3) {
              __assert_fail("checkPixels<float> (fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x370,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar6 == 2) &&
                  (bVar3 = checkPixels<Imath_3_2::half>
                                     ((Array2D<Imath_3_2::half> *)
                                      CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                      in_stack_fffffffffffffaec,iVar7), !bVar3)) {
            __assert_fail("checkPixels<half> (hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x373,"void (anonymous namespace)::readWholeFiles(int)");
          }
          Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1bb7df);
          break;
        case 1:
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_168,local_d0,local_11c);
          local_1c0._84_4_ = Imf_3_2::TiledInputPart::numXLevels();
          local_1c0._80_4_ = Imf_3_2::TiledInputPart::numYLevels();
          for (local_1c0._76_4_ = 0; (int)local_1c0._76_4_ < (int)local_1c0._84_4_;
              local_1c0._76_4_ = local_1c0._76_4_ + 1) {
            for (local_1c0._72_4_ = 0; (int)local_1c0._72_4_ < (int)local_1c0._80_4_;
                local_1c0._72_4_ = local_1c0._72_4_ + 1) {
              bVar4 = Imf_3_2::TiledInputPart::isValidLevel((int)local_168,local_1c0._76_4_);
              if ((bVar4 & 1) != 0) {
                local_1c0._68_4_ = Imf_3_2::TiledInputPart::levelWidth((int)local_168);
                local_1c0._64_4_ = Imf_3_2::TiledInputPart::levelHeight((int)local_168);
                Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1bb942);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffbf0,
                                    (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                                    (Array2D<unsigned_int> *)in_stack_fffffffffffffbe0,
                                    (Array2D<float> *)fData_00,
                                    (Array2D<Imath_3_2::half> *)
                                    CONCAT44(uVar17,in_stack_fffffffffffffbd0),(int)(uVar16 >> 0x20)
                                    ,(int)in_stack_fffffffffffffc00);
                Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)local_168);
                local_1c0._12_4_ = Imf_3_2::TiledInputPart::numXTiles((int)local_168);
                local_1c0._8_4_ = Imf_3_2::TiledInputPart::numYTiles((int)local_168);
                iVar7 = local_1c0._72_4_;
                Imf_3_2::TiledInputPart::readTiles
                          ((int)local_168,0,local_1c0._12_4_ + -1,0,local_1c0._8_4_ - _S_black,
                           local_1c0._76_4_);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_11c);
                iVar6 = *pvVar13;
                if (iVar6 == 0) {
                  bVar3 = checkPixels<unsigned_int>
                                    ((Array2D<unsigned_int> *)
                                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                     in_stack_fffffffffffffaec,iVar7);
                  if (!bVar3) {
                    __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x39c,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar6 == 1) {
                  bVar3 = checkPixels<float>((Array2D<float> *)
                                             CONCAT44(in_stack_fffffffffffffaf4,
                                                      in_stack_fffffffffffffaf0),
                                             in_stack_fffffffffffffaec,iVar7);
                  if (!bVar3) {
                    __assert_fail("checkPixels<float> (fData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x39f,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar6 == 2) &&
                        (bVar3 = checkPixels<Imath_3_2::half>
                                           ((Array2D<Imath_3_2::half> *)
                                            CONCAT44(in_stack_fffffffffffffaf4,
                                                     in_stack_fffffffffffffaf0),
                                            in_stack_fffffffffffffaec,iVar7), !bVar3)) {
                  __assert_fail("checkPixels<half> (hData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                ,0x3a2,"void (anonymous namespace)::readWholeFiles(int)");
                }
                Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1bbbb7);
              }
            }
          }
          break;
        case 2:
          Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)local_1c0,local_d0,local_11c);
          Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffb10);
          Imf_3_2::Array2D<unsigned_int>::resizeErase
                    ((Array2D<unsigned_int> *)in_stack_fffffffffffffb10,
                     (long)in_stack_fffffffffffffb08,(long)in_stack_fffffffffffffb00);
          puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_c0,0);
          uVar15 = 0;
          in_stack_fffffffffffffaf0 = 0;
          Imf_3_2::Slice::Slice
                    ((Slice *)(local_268 + 8),UINT,(char *)puVar14,4,0x40,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_228);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          setInputDeepFrameBuffer
                    (in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                     in_stack_fffffffffffffbe0,fData_00,
                     (Array2D<Imath_3_2::half_*> *)CONCAT44(uVar17,in_stack_fffffffffffffbd0),
                     (int)(uVar16 >> 0x20),(int)in_stack_fffffffffffffc00);
          Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_1c0);
          Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)local_1c0,0);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          allocatePixels(in_stack_fffffffffffffb24,
                         (Array2D<unsigned_int> *)
                         CONCAT17(in_stack_fffffffffffffb1f,
                                  CONCAT16(in_stack_fffffffffffffb1e,
                                           CONCAT15(in_stack_fffffffffffffb1d,
                                                    in_stack_fffffffffffffb18))),
                         (Array2D<unsigned_int_*> *)in_stack_fffffffffffffb10,
                         (Array2D<float_*> *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                         in_stack_fffffffffffffafc,in_stack_fffffffffffffb30);
          iVar7 = (int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
          Imf_3_2::DeepScanLineInputPart::readPixels((int)local_1c0,0);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_11c);
          iVar6 = *pvVar13;
          if (iVar6 == 0) {
            bVar3 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                               (Array2D<unsigned_int_*> *)CONCAT44(in_stack_fffffffffffffafc,uVar15)
                               ,in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3cf,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar6 == 1) {
            bVar3 = checkPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                                       (Array2D<float_*> *)
                                       CONCAT44(in_stack_fffffffffffffafc,uVar15),
                                       in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
            if (!bVar3) {
              __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3d3,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar6 == 2) &&
                  (bVar3 = checkPixels<Imath_3_2::half>
                                     ((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                                      (Array2D<Imath_3_2::half_*> *)
                                      CONCAT44(in_stack_fffffffffffffafc,uVar15),
                                      in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0), !bVar3))
          {
            __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x3d7,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_11c);
          releasePixels(iVar7,(Array2D<unsigned_int_*> *)in_stack_fffffffffffffb08,
                        (Array2D<float_*> *)in_stack_fffffffffffffb00,
                        (Array2D<Imath_3_2::half_*> *)CONCAT44(in_stack_fffffffffffffafc,uVar15),
                        in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
          Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1bbf18);
          break;
        case 3:
          Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)local_268,local_d0,local_11c);
          local_26c = Imf_3_2::DeepTiledInputPart::numXLevels();
          local_270 = Imf_3_2::DeepTiledInputPart::numYLevels();
          for (local_274 = 0; local_274 < local_26c; local_274 = local_274 + 1) {
            for (local_278 = 0; local_278 < local_270; local_278 = local_278 + 1) {
              bVar4 = Imf_3_2::DeepTiledInputPart::isValidLevel((int)local_268,local_274);
              if ((bVar4 & 1) != 0) {
                local_27c = Imf_3_2::DeepTiledInputPart::levelWidth((int)local_268);
                local_280 = Imf_3_2::DeepTiledInputPart::levelHeight((int)local_268);
                Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffb10);
                Imf_3_2::Array2D<unsigned_int>::resizeErase
                          ((Array2D<unsigned_int> *)in_stack_fffffffffffffb10,
                           (long)in_stack_fffffffffffffb08,(long)in_stack_fffffffffffffb00);
                puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_c0,0);
                uVar15 = 0;
                in_stack_fffffffffffffaf0 = 0;
                Imf_3_2::Slice::Slice
                          (local_320,UINT,(char *)puVar14,4,(long)local_27c << 2,1,1,0.0,false,false
                          );
                Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_2e8);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                setInputDeepFrameBuffer
                          (in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20)
                           ,in_stack_fffffffffffffbe0,fData_00,
                           (Array2D<Imath_3_2::half_*> *)CONCAT44(uVar17,in_stack_fffffffffffffbd0),
                           (int)(uVar16 >> 0x20),(int)in_stack_fffffffffffffc00);
                Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_268);
                iVar6 = Imf_3_2::DeepTiledInputPart::numXTiles((int)local_268);
                iVar7 = Imf_3_2::DeepTiledInputPart::numYTiles((int)local_268);
                Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                          ((int)local_268,0,iVar6 + -1,0,iVar7 + -1,local_274);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                allocatePixels(in_stack_fffffffffffffb24,
                               (Array2D<unsigned_int> *)
                               CONCAT17(in_stack_fffffffffffffb1f,
                                        CONCAT16(in_stack_fffffffffffffb1e,
                                                 CONCAT15(in_stack_fffffffffffffb1d,
                                                          in_stack_fffffffffffffb18))),
                               (Array2D<unsigned_int_*> *)in_stack_fffffffffffffb10,
                               (Array2D<float_*> *)in_stack_fffffffffffffb08,
                               in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                               in_stack_fffffffffffffb30);
                Imf_3_2::DeepTiledInputPart::readTiles
                          ((int)local_268,0,iVar6 + -1,0,iVar7 + -1,local_274);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_11c);
                iVar6 = *pvVar13;
                if (iVar6 == 0) {
                  in_stack_fffffffffffffb1f =
                       checkPixels<unsigned_int>
                                 ((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                                  (Array2D<unsigned_int_*> *)
                                  CONCAT44(in_stack_fffffffffffffafc,uVar15),
                                  in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
                  if (!(bool)in_stack_fffffffffffffb1f) {
                    __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x424,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar6 == 1) {
                  in_stack_fffffffffffffb1e =
                       checkPixels<float>((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                                          (Array2D<float_*> *)
                                          CONCAT44(in_stack_fffffffffffffafc,uVar15),
                                          in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
                  if (!(bool)in_stack_fffffffffffffb1e) {
                    __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x428,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar6 == 2) &&
                        (in_stack_fffffffffffffb1d =
                              checkPixels<Imath_3_2::half>
                                        ((Array2D<unsigned_int> *)in_stack_fffffffffffffb00,
                                         (Array2D<Imath_3_2::half_*> *)
                                         CONCAT44(in_stack_fffffffffffffafc,uVar15),
                                         in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                        !(bool)in_stack_fffffffffffffb1d)) {
                  __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                ,0x42c,"void (anonymous namespace)::readWholeFiles(int)");
                }
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_11c);
                releasePixels((int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                              (Array2D<unsigned_int_*> *)in_stack_fffffffffffffb08,
                              (Array2D<float_*> *)in_stack_fffffffffffffb00,
                              (Array2D<Imath_3_2::half_*> *)
                              CONCAT44(in_stack_fffffffffffffafc,uVar15),in_stack_fffffffffffffaf4,
                              in_stack_fffffffffffffaf0);
                Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1bc47a);
              }
            }
          }
        }
        in_stack_fffffffffffffb10 =
             (DeepFrameBuffer *)std::operator<<((ostream *)&std::cerr,"part ");
        in_stack_fffffffffffffb08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::ostream::operator<<(in_stack_fffffffffffffb10,local_11c);
        std::operator<<((ostream *)in_stack_fffffffffffffb08," ok ");
        local_128 = local_128 + 1;
      } while( true );
    }
    local_e0 = Imf_3_2::MultiPartInputFile::header((int)local_d0);
    Imf_3_2::Header::displayWindow();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_3_2::Header::displayWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb00,
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    if (!bVar3) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32b,"void (anonymous namespace)::readWholeFiles(int)");
    }
    Imf_3_2::Header::dataWindow();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    Imf_3_2::Header::dataWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb00,
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    if (!bVar3) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar9 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar9;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pfVar9 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32d,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
    bVar3 = Imath_3_2::Vec2<float>::operator==(this,v);
    if (!bVar3) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar9 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar9;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pfVar9 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) break;
    piVar10 = (int *)Imf_3_2::Header::lineOrder();
    iVar6 = *piVar10;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    piVar10 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar6 != *piVar10) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x331,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar10 = (int *)Imf_3_2::Header::compression();
    iVar6 = *piVar10;
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    piVar10 = (int *)Imf_3_2::Header::compression();
    if (iVar6 != *piVar10) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this_00 = (ChannelList *)Imf_3_2::Header::channels();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    pCVar11 = (ChannelList *)Imf_3_2::Header::channels();
    bVar4 = Imf_3_2::ChannelList::operator==(this_00,pCVar11);
    if ((bVar4 & 1) == 0) {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x333,"void (anonymous namespace)::readWholeFiles(int)");
    }
    Imf_3_2::Header::name_abi_cxx11_();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               (anonymous_namespace)::headers,(long)local_d4);
    in_stack_fffffffffffffc00 = Imf_3_2::Header::name_abi_cxx11_();
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    if (!_Var5) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x334,"void (anonymous namespace)::readWholeFiles(int)");
    }
    if ((local_4 == 1) && (local_d4 == 0)) {
      Imf_3_2::Header::type_abi_cxx11_();
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 (anonymous_namespace)::headers,(long)local_d4);
      in_stack_fffffffffffffbf0 = (DeepFrameBuffer *)Imf_3_2::Header::type_abi_cxx11_();
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      if (!bVar3) {
        __assert_fail("header.type () != headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x337,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      in_stack_fffffffffffffbe8 = Imf_3_2::Header::type_abi_cxx11_();
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 (anonymous_namespace)::headers,(long)local_d4);
      in_stack_fffffffffffffbe0 = (Array2D<unsigned_int_*> *)Imf_3_2::Header::type_abi_cxx11_();
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      if (!_Var5) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x33b,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    local_d4 = local_d4 + 1;
  }
  __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                ,0x330,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (filename.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        if (modification == 1 && i == 0)
        {
            assert (header.type () != headers[i].type ());
        }
        else
        {
            assert (header.type () == headers[i].type ());
        }
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification > 0 ? 1 : 0;
         i < static_cast<int> (headers.size ());
         i++)
        shuffledPartNumber.push_back (i);
    for (size_t i = 0; i < shuffledPartNumber.size (); i++)
    {
        size_t a = random_int (shuffledPartNumber.size ());
        size_t b = random_int (shuffledPartNumber.size ());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size (); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}